

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_optimizations.cpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::RegexOptimizationRule::Apply
          (RegexOptimizationRule *this,LogicalOperator *op,
          vector<std::reference_wrapper<duckdb::Expression>,_true> *bindings,bool *changes_made,
          bool is_root)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var2;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var3;
  undefined8 uVar4;
  int iVar5;
  reference pvVar6;
  BoundFunctionExpression *pBVar7;
  BoundConstantExpression *expr;
  ClientContext *context;
  string *psVar8;
  pointer pBVar9;
  reference pvVar10;
  pointer *__ptr;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar11;
  Regexp *regexp;
  element_type *peVar12;
  element_type *peVar13;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_3c8;
  LikeString escaped_like_string;
  undefined1 local_398 [16];
  LikeString like_string;
  string local_360;
  string local_340;
  LogicalType local_320;
  Options parsed_options;
  string patt_str;
  undefined1 local_2c8 [8];
  _Alloc_hider _Stack_2c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2b8;
  undefined1 auStack_2b0 [280];
  Value constant_value;
  RE2 pattern;
  RegexpMatchesBindData regexp_bind_data;
  
  pvVar6 = vector<std::reference_wrapper<duckdb::Expression>,_true>::get<true>
                     ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)changes_made,0);
  pBVar7 = BaseExpression::Cast<duckdb::BoundFunctionExpression>
                     (&pvVar6->_M_data->super_BaseExpression);
  pvVar6 = vector<std::reference_wrapper<duckdb::Expression>,_true>::get<true>
                     ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)changes_made,2);
  expr = BaseExpression::Cast<duckdb::BoundConstantExpression>
                   (&pvVar6->_M_data->super_BaseExpression);
  RegexpMatchesBindData::RegexpMatchesBindData
            (&regexp_bind_data,
             (RegexpMatchesBindData *)
             (pBVar7->bind_info).
             super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t
             .
             super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
             .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl);
  context = Rule::GetContext((Rule *)op);
  ExpressionExecutor::EvaluateScalar(&constant_value,context,&expr->super_Expression,false);
  parsed_options.never_nl_ = regexp_bind_data.super_RegexpBaseBindData.options.never_nl_;
  parsed_options.dot_nl_ = regexp_bind_data.super_RegexpBaseBindData.options.dot_nl_;
  parsed_options.never_capture_ = regexp_bind_data.super_RegexpBaseBindData.options.never_capture_;
  parsed_options.case_sensitive_ = regexp_bind_data.super_RegexpBaseBindData.options.case_sensitive_
  ;
  parsed_options.perl_classes_ = regexp_bind_data.super_RegexpBaseBindData.options.perl_classes_;
  parsed_options.word_boundary_ = regexp_bind_data.super_RegexpBaseBindData.options.word_boundary_;
  parsed_options.one_line_ = regexp_bind_data.super_RegexpBaseBindData.options.one_line_;
  parsed_options._23_1_ = regexp_bind_data.super_RegexpBaseBindData.options._23_1_;
  parsed_options.max_mem_ = regexp_bind_data.super_RegexpBaseBindData.options.max_mem_;
  parsed_options.encoding_ = regexp_bind_data.super_RegexpBaseBindData.options.encoding_;
  parsed_options.posix_syntax_ = regexp_bind_data.super_RegexpBaseBindData.options.posix_syntax_;
  parsed_options.longest_match_ = regexp_bind_data.super_RegexpBaseBindData.options.longest_match_;
  parsed_options.log_errors_ = regexp_bind_data.super_RegexpBaseBindData.options.log_errors_;
  parsed_options.literal_ = regexp_bind_data.super_RegexpBaseBindData.options.literal_;
  if ((expr->value).is_null == true) {
    LogicalType::LogicalType(&local_320,&(pBVar7->super_Expression).return_type);
    Value::Value((Value *)local_2c8,&local_320);
    make_uniq<duckdb::BoundConstantExpression,duckdb::Value>((duckdb *)&pattern,(Value *)local_2c8);
    (this->super_Rule)._vptr_Rule = (_func_int **)pattern.pattern_;
    pattern.pattern_ = (string *)0x0;
    Value::~Value((Value *)local_2c8);
    LogicalType::~LogicalType(&local_320);
    goto LAB_0058daee;
  }
  psVar8 = StringValue::Get_abi_cxx11_(&constant_value);
  ::std::__cxx11::string::string((string *)&patt_str,(string *)psVar8);
  iVar5 = (*(expr->super_Expression).super_BaseExpression._vptr_BaseExpression[0xf])(expr);
  if ((char)iVar5 == '\0') {
    (this->super_Rule)._vptr_Rule = (_func_int **)0x0;
  }
  else {
    local_2c8 = (undefined1  [8])patt_str._M_dataplus._M_p;
    _Stack_2c0._M_p = (pointer)patt_str._M_string_length;
    duckdb_re2::RE2::RE2(&pattern,(StringPiece *)local_2c8,&parsed_options);
    if ((pattern._68_4_ & 0x1fffffff) == 0) {
      LikeString::LikeString(&like_string);
      if ((pattern.entire_regexp_)->op_ - 3 < 2) {
        GetLikeStringEscaped(&escaped_like_string,pattern.entire_regexp_,true);
        if (escaped_like_string.exists == false) {
          (this->super_Rule)._vptr_Rule = (_func_int **)0x0;
        }
        else {
          local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
          paVar1 = &escaped_like_string.like_string.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)escaped_like_string.like_string._M_dataplus._M_p == paVar1) {
            local_340.field_2._8_8_ = escaped_like_string.like_string.field_2._8_8_;
          }
          else {
            local_340._M_dataplus._M_p = escaped_like_string.like_string._M_dataplus._M_p;
          }
          local_340._M_string_length = escaped_like_string.like_string._M_string_length;
          escaped_like_string.like_string._M_string_length = 0;
          escaped_like_string.like_string.field_2._M_local_buf[0] = '\0';
          escaped_like_string.like_string._M_dataplus._M_p = (pointer)paVar1;
          Value::Value((Value *)local_2c8,&local_340);
          make_uniq<duckdb::BoundConstantExpression,duckdb::Value>
                    ((duckdb *)&local_3c8,(Value *)local_2c8);
          Value::~Value((Value *)local_2c8);
          ::std::__cxx11::string::~string((string *)&local_340);
          GetStringContains();
          make_uniq<duckdb::BoundFunctionExpression,duckdb::LogicalType&,duckdb::ScalarFunction,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,decltype(nullptr)>
                    ((LogicalType *)local_398,
                     (ScalarFunction *)&(pBVar7->super_Expression).return_type,
                     (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                      *)local_2c8,(void **)&pBVar7->children);
          ScalarFunction::~ScalarFunction((ScalarFunction *)local_2c8);
          _Var3._M_head_impl = local_3c8._M_head_impl;
          local_3c8._M_head_impl = (Expression *)0x0;
          pBVar9 = unique_ptr<duckdb::BoundFunctionExpression,_std::default_delete<duckdb::BoundFunctionExpression>,_true>
                   ::operator->((unique_ptr<duckdb::BoundFunctionExpression,_std::default_delete<duckdb::BoundFunctionExpression>,_true>
                                 *)local_398);
          pvVar10 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    ::get<true>(&pBVar9->children,1);
          _Var2._M_head_impl =
               (pvVar10->
               super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
               super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
               .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
          (pvVar10->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
          _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var3._M_head_impl;
          if (_Var2._M_head_impl != (Expression *)0x0) {
            (**(code **)(*(long *)&(_Var2._M_head_impl)->super_BaseExpression + 8))();
          }
          (this->super_Rule)._vptr_Rule = (_func_int **)local_398._0_8_;
          if (local_3c8._M_head_impl != (Expression *)0x0) {
            (*((local_3c8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
          }
        }
        ::std::__cxx11::string::~string((string *)&escaped_like_string.like_string);
      }
      else {
        if ((pattern.entire_regexp_)->op_ == 5) {
          local_2b8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          auStack_2b0._0_8_ = 0;
          local_2c8 = (undefined1  [8])0x0;
          _Stack_2c0._M_p = (pointer)0x0;
          auStack_2b0._8_8_ = 0;
          LikeString::LikeString((LikeString *)local_2c8);
          peVar12 = (element_type *)(ulong)(pattern.entire_regexp_)->nsub_;
          if (peVar12 < (element_type *)0x2) {
            paVar11 = &(pattern.entire_regexp_)->field_5;
          }
          else {
            paVar11 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)
                      ((pattern.entire_regexp_)->field_5).submany_;
          }
          local_398._8_8_ =
               (long)&peVar12[-1].extension_info.
                      super_unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>
                      ._M_t.
                      super___uniq_ptr_impl<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb::ExtensionTypeInfo_*,_std::default_delete<duckdb::ExtensionTypeInfo>_>
                      .super__Head_base<0UL,_duckdb::ExtensionTypeInfo_*,_false>._M_head_impl + 7;
          for (peVar13 = (element_type *)0x0; peVar12 != peVar13;
              peVar13 = (element_type *)((long)&peVar13->_vptr_ExtraTypeInfo + 1)) {
            regexp = paVar11[(long)peVar13].subone_;
            switch(regexp->op_) {
            case '\x02':
              break;
            case '\x03':
            case '\x04':
              if (peVar13 == (element_type *)0x0) {
                ::std::__cxx11::string::append((char *)&_Stack_2c0);
                regexp = paVar11->subone_;
              }
              GetLikeStringEscaped(&escaped_like_string,regexp,false);
              if (escaped_like_string.exists != true) goto LAB_0058da0b;
              ::std::__cxx11::string::append((string *)&_Stack_2c0);
              local_2c8[1] = escaped_like_string.escaped;
              if ((element_type *)local_398._8_8_ == peVar13) {
                ::std::__cxx11::string::append((char *)&_Stack_2c0);
              }
              ::std::__cxx11::string::~string((string *)&escaped_like_string.like_string);
              break;
            case '\x05':
            case '\x06':
            case '\b':
            case '\t':
            case '\n':
            case '\v':
switchD_0058d800_caseD_5:
              local_2c8 = (undefined1  [8])((ulong)local_2c8 & 0xffffffffffffff00);
              goto LAB_0058d9f9;
            case '\a':
              if ((regexp->nsub_ != 1) || (((regexp->field_5).subone_)->op_ != '\f'))
              goto switchD_0058d800_caseD_5;
LAB_0058d8d6:
              ::std::__cxx11::string::append((char *)&_Stack_2c0);
              break;
            case '\f':
              if (peVar13 == (element_type *)0x0) {
                ::std::__cxx11::string::append((char *)&_Stack_2c0);
              }
              ::std::__cxx11::string::append((char *)&_Stack_2c0);
              if ((element_type *)local_398._8_8_ == peVar13) goto LAB_0058d8d6;
              break;
            default:
              if (1 < regexp->op_ - 0x12) goto switchD_0058d800_caseD_5;
            }
          }
LAB_0058d9f9:
          LikeString::LikeString(&escaped_like_string,(LikeString *)local_2c8);
LAB_0058da0b:
          ::std::__cxx11::string::~string((string *)&_Stack_2c0);
          LikeString::operator=(&like_string,&escaped_like_string);
          ::std::__cxx11::string::~string((string *)&escaped_like_string.like_string);
          if ((like_string.exists & 1U) != 0) {
            if ((long)(pBVar7->children).
                      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(pBVar7->children).
                      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_start == 0x18) {
              ::std::
              vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ::pop_back((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                          *)&pBVar7->children);
            }
            LikeFun::GetFunction();
            local_3c8._M_head_impl = (Expression *)0x0;
            make_uniq<duckdb::BoundFunctionExpression,duckdb::LogicalType&,duckdb::ScalarFunction,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,decltype(nullptr)>
                      ((LogicalType *)&escaped_like_string,
                       (ScalarFunction *)&(pBVar7->super_Expression).return_type,
                       (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                        *)local_2c8,(void **)&pBVar7->children);
            ScalarFunction::~ScalarFunction((ScalarFunction *)local_2c8);
            local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
            paVar1 = &like_string.like_string.field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)like_string.like_string._M_dataplus._M_p == paVar1) {
              local_360.field_2._8_8_ = like_string.like_string.field_2._8_8_;
            }
            else {
              local_360._M_dataplus._M_p = like_string.like_string._M_dataplus._M_p;
            }
            local_360._M_string_length = like_string.like_string._M_string_length;
            like_string.like_string._M_string_length = 0;
            like_string.like_string.field_2._M_local_buf[0] = '\0';
            like_string.like_string._M_dataplus._M_p = (pointer)paVar1;
            Value::Value((Value *)local_2c8,&local_360);
            make_uniq<duckdb::BoundConstantExpression,duckdb::Value>
                      ((duckdb *)&local_3c8,(Value *)local_2c8);
            Value::~Value((Value *)local_2c8);
            ::std::__cxx11::string::~string((string *)&local_360);
            _Var3._M_head_impl = local_3c8._M_head_impl;
            local_3c8._M_head_impl = (Expression *)0x0;
            pBVar9 = unique_ptr<duckdb::BoundFunctionExpression,_std::default_delete<duckdb::BoundFunctionExpression>,_true>
                     ::operator->((unique_ptr<duckdb::BoundFunctionExpression,_std::default_delete<duckdb::BoundFunctionExpression>,_true>
                                   *)&escaped_like_string);
            pvVar10 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                      ::get<true>(&pBVar9->children,1);
            _Var2._M_head_impl =
                 (pvVar10->
                 super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
                 _M_t.
                 super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                 .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
            (pvVar10->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
            )._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var3._M_head_impl;
            if (_Var2._M_head_impl != (Expression *)0x0) {
              (**(code **)(*(long *)&(_Var2._M_head_impl)->super_BaseExpression + 8))();
            }
            uVar4 = escaped_like_string._0_8_;
            escaped_like_string.exists = false;
            escaped_like_string.escaped = false;
            escaped_like_string._2_6_ = 0;
            (this->super_Rule)._vptr_Rule = (_func_int **)uVar4;
            if ((local_3c8._M_head_impl != (Expression *)0x0) &&
               ((*((local_3c8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])(),
               escaped_like_string._0_8_ != 0)) {
              (**(code **)(*(long *)escaped_like_string._0_8_ + 8))();
            }
            goto LAB_0058daca;
          }
        }
        else {
          like_string.exists = false;
        }
        (this->super_Rule)._vptr_Rule = (_func_int **)0x0;
      }
LAB_0058daca:
      ::std::__cxx11::string::~string((string *)&like_string.like_string);
    }
    else {
      (this->super_Rule)._vptr_Rule = (_func_int **)0x0;
    }
    duckdb_re2::RE2::~RE2(&pattern);
  }
  ::std::__cxx11::string::~string((string *)&patt_str);
LAB_0058daee:
  Value::~Value(&constant_value);
  RegexpMatchesBindData::~RegexpMatchesBindData(&regexp_bind_data);
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> RegexOptimizationRule::Apply(LogicalOperator &op, vector<reference<Expression>> &bindings,
                                                    bool &changes_made, bool is_root) {
	auto &root = bindings[0].get().Cast<BoundFunctionExpression>();
	auto &constant_expr = bindings[2].get().Cast<BoundConstantExpression>();
	D_ASSERT(root.children.size() == 2 || root.children.size() == 3);
	auto regexp_bind_data = root.bind_info.get()->Cast<RegexpMatchesBindData>();

	auto constant_value = ExpressionExecutor::EvaluateScalar(GetContext(), constant_expr);
	D_ASSERT(constant_value.type() == constant_expr.return_type);

	duckdb_re2::RE2::Options parsed_options = regexp_bind_data.options;

	if (constant_expr.value.IsNull()) {
		return make_uniq<BoundConstantExpression>(Value(root.return_type));
	}
	auto patt_str = StringValue::Get(constant_value);

	// the constant_expr is a scalar expression that we have to fold
	if (!constant_expr.IsFoldable()) {
		return nullptr;
	};

	duckdb_re2::RE2 pattern(patt_str, parsed_options);
	if (!pattern.ok()) {
		return nullptr; // this should fail somewhere else
	}

	LikeString like_string;
	// check for a like string. If we can convert it to a like string, the like string
	// optimizer will further optimize suffix and prefix things.
	if (pattern.Regexp()->op() == duckdb_re2::kRegexpLiteralString ||
	    pattern.Regexp()->op() == duckdb_re2::kRegexpLiteral) {
		// convert to contains.
		LikeString escaped_like_string = GetLikeStringEscaped(pattern.Regexp(), true);
		if (!escaped_like_string.exists) {
			return nullptr;
		}
		auto parameter = make_uniq<BoundConstantExpression>(Value(std::move(escaped_like_string.like_string)));
		auto contains = make_uniq<BoundFunctionExpression>(root.return_type, GetStringContains(),
		                                                   std::move(root.children), nullptr);
		contains->children[1] = std::move(parameter);

		return std::move(contains);
	} else if (pattern.Regexp()->op() == duckdb_re2::kRegexpConcat) {
		like_string = LikeMatchFromRegex(pattern);
	} else {
		like_string.exists = false;
	}

	if (!like_string.exists) {
		return nullptr;
	}

	// if regexp had options, remove them so the new Like Expression can be matched for other optimizers.
	if (root.children.size() == 3) {
		root.children.pop_back();
		D_ASSERT(root.children.size() == 2);
	}

	auto like_expression =
	    make_uniq<BoundFunctionExpression>(root.return_type, LikeFun::GetFunction(), std::move(root.children), nullptr);
	auto parameter = make_uniq<BoundConstantExpression>(Value(std::move(like_string.like_string)));
	like_expression->children[1] = std::move(parameter);
	return std::move(like_expression);
}